

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O2

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,784ul>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,784ul>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  long lVar1;
  value_type *pvVar2;
  node_type *pnVar3;
  scalar_type split_val;
  size_type split_dim;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> split;
  box_type right;
  
  pvVar2 = chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::
           allocate(*(chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>
                      **)(this + 0x20));
  if ((long)*(int *)(this + 8) < (long)end._M_current - (long)begin._M_current >> 2) {
    split._M_current = (int *)0x0;
    splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,784ul>>>
    ::operator()((splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,784ul>>>
                  *)(this + 0x10),depth,begin,end,box,&split,&split_dim,&split_val);
    memcpy(&right,box,0x1880);
    (box->storage_).coords_max._M_elems[split_dim] = split_val;
    right.storage_.coords_min._M_elems[split_dim] = split_val;
    pnVar3 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,depth + 1,begin,split,box);
    (pvVar2->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>).
    left = pnVar3;
    pnVar3 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,depth + 1,split,end,&right);
    (pvVar2->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>).
    right = pnVar3;
    (pvVar2->data).branch.split_dim = (int)split_dim;
    (pvVar2->data).branch.left_min = (box->storage_).coords_min._M_elems[split_dim];
    (pvVar2->data).branch.left_max = (box->storage_).coords_max._M_elems[split_dim];
    (pvVar2->data).branch.right_min = right.storage_.coords_min._M_elems[split_dim];
    (pvVar2->data).branch.right_max = right.storage_.coords_max._M_elems[split_dim];
    box_base<pico_tree::internal::box<float,784ul>>::fit<pico_tree::internal::box<float,784ul>>
              ((box_base<pico_tree::internal::box<float,_784UL>_> *)box,
               (box_base<pico_tree::internal::box<float,_784UL>_> *)&right);
  }
  else {
    lVar1 = **(long **)(this + 0x18);
    (pvVar2->data).branch.split_dim = (int)((ulong)((long)begin._M_current - lVar1) >> 2);
    (pvVar2->data).leaf.end_idx = (int)((ulong)((long)end._M_current - lVar1) >> 2);
    (pvVar2->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>).
    left = (kd_tree_node_topological<int,_float> *)0x0;
    (pvVar2->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>).
    right = (kd_tree_node_topological<int,_float> *)0x0;
    compute_bounding_box<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (this,begin,end,box);
  }
  return pvVar2;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }